

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  anon_union_8_6_45a55102_for_u n;
  expdesc key;
  
  n.strval = str_checkname(ls);
  fs = ls->fs;
  singlevaraux(fs,n.strval,var,1);
  if (var->k == VVOID) {
    singlevaraux(fs,ls->envn,var,1);
    luaK_exp2anyregup(fs,var);
    key.t = -1;
    key.f = -1;
    key.k = VKSTR;
    key.u.strval = n.strval;
    luaK_indexed(fs,var,&key);
  }
  return;
}

Assistant:

static void singlevar (LexState *ls, expdesc *var) {
  TString *varname = str_checkname(ls);
  FuncState *fs = ls->fs;
  singlevaraux(fs, varname, var, 1);
  if (var->k == VVOID) {  /* global name? */
    expdesc key;
    singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
    lua_assert(var->k != VVOID);  /* this one must exist */
    luaK_exp2anyregup(fs, var);  /* but could be a constant */
    codestring(&key, varname);  /* key is variable name */
    luaK_indexed(fs, var, &key);  /* env[varname] */
  }
}